

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O0

void __thiscall rcg::Stream::attachBuffers(Stream *this,bool enable)

{
  element_type *this_00;
  void *pvVar1;
  byte in_SIL;
  long in_RDI;
  shared_ptr<GenApi_3_4::CNodeMapRef> rnodemap;
  shared_ptr<GenApi_3_4::CNodeMapRef> *in_stack_ffffffffffffff38;
  shared_ptr<GenApi_3_4::CNodeMapRef> *in_stack_ffffffffffffff40;
  allocator *paVar2;
  Device *in_stack_ffffffffffffff68;
  string local_90 [64];
  string *in_stack_ffffffffffffffb0;
  shared_ptr<GenApi_3_4::CNodeMapRef> *in_stack_ffffffffffffffb8;
  Buffer *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffe0;
  Device *in_stack_ffffffffffffffe8;
  
  if ((in_SIL & 1) == 0) {
    std::shared_ptr<GenApi_3_4::CNodeMapRef>::shared_ptr
              (in_stack_ffffffffffffff40,(nullptr_t)(in_RDI + 0x10));
    paVar2 = (allocator *)&stack0xffffffffffffff6f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"",paVar2);
    Buffer::setNodemap(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0
                      );
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
    std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
              ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x1201cb);
  }
  else {
    this_00 = std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x120054);
    pvVar1 = Device::getHandle(this_00);
    if (pvVar1 != (void *)0x0) {
      std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x120079);
      Device::getRemoteNodeMap(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
      std::shared_ptr<GenApi_3_4::CNodeMapRef>::shared_ptr
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1200bc);
      Device::getTLType_abi_cxx11_(in_stack_ffffffffffffff68);
      Buffer::setNodemap(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                         in_stack_ffffffffffffffb0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
      std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
                ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x1200fb);
      std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
                ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x120108);
    }
  }
  return;
}

Assistant:

void Stream::attachBuffers(bool enable)
{
  if (enable)
  {
    if (parent->getHandle() != 0)
    {
      std::shared_ptr<GenApi::CNodeMapRef> rnodemap=parent->getRemoteNodeMap();
      buffer.setNodemap(rnodemap, parent->getTLType());
    }
  }
  else
  {
    buffer.setNodemap(0, "");
  }
}